

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_bitonic_sort(int **dst,size_t size)

{
  int *_sort_swap_temp_1;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *_sort_swap_temp_4;
  int *piVar13;
  int iVar14;
  int *_sort_swap_temp_14;
  int *piVar15;
  int *_sort_swap_temp_7;
  int *_sort_swap_temp_8;
  int iVar16;
  int *_sort_swap_temp;
  int *piVar17;
  int *_sort_swap_temp_11;
  int *_sort_swap_temp_6;
  int *_sort_swap_temp_2;
  int *_sort_swap_temp_5;
  int *_sort_swap_temp_3;
  int *_sort_swap_temp_15;
  int *_sort_swap_temp_33;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  int *_sort_swap_temp_102;
  int *local_38;
  int *_sort_swap_temp_109;
  
  switch(size) {
  case 0:
  case 1:
    break;
  case 2:
    piVar5 = *dst;
    piVar10 = dst[1];
    if (*piVar5 <= *piVar10) {
      return;
    }
    goto LAB_00107c2c;
  case 3:
    piVar10 = dst[1];
    piVar5 = dst[2];
    iVar16 = *piVar10;
    iVar14 = *piVar5;
    piVar8 = piVar5;
    if (iVar14 < iVar16) {
      dst[1] = piVar5;
      dst[2] = piVar10;
      piVar8 = piVar10;
      piVar10 = piVar5;
      iVar14 = iVar16;
    }
    piVar5 = *dst;
    iVar16 = *piVar5;
    if (iVar14 < iVar16) {
      *dst = piVar8;
      dst[2] = piVar5;
      iVar16 = *piVar8;
      piVar5 = piVar8;
    }
    if (iVar16 <= *piVar10) {
      return;
    }
LAB_00107c2c:
    *dst = piVar10;
    dst[1] = piVar5;
    break;
  case 4:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar9 = dst[2];
    piVar10 = dst[3];
    iVar16 = *piVar9;
    iVar14 = *piVar10;
    piVar11 = piVar10;
    if (iVar14 < iVar16) {
      dst[2] = piVar10;
      dst[3] = piVar9;
      piVar11 = piVar9;
      piVar9 = piVar10;
      iVar16 = iVar14;
    }
    if (iVar16 < *piVar8) {
      *dst = piVar9;
      dst[2] = piVar8;
      piVar9 = piVar8;
    }
    iVar16 = *piVar5;
    iVar14 = *piVar11;
    if (iVar14 < iVar16) {
      dst[1] = piVar11;
      dst[3] = piVar5;
      piVar5 = piVar11;
      iVar16 = iVar14;
    }
    if (iVar16 <= *piVar9) {
      return;
    }
    goto LAB_001082cb;
  case 5:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[3];
    piVar11 = dst[4];
    iVar16 = *piVar10;
    iVar14 = *piVar11;
    piVar7 = piVar11;
    if (iVar14 < iVar16) {
      dst[3] = piVar11;
      dst[4] = piVar10;
      piVar7 = piVar10;
      piVar10 = piVar11;
      iVar14 = iVar16;
    }
    piVar11 = dst[2];
    iVar16 = *piVar11;
    piVar9 = piVar11;
    if (iVar14 < iVar16) {
      dst[2] = piVar7;
      dst[4] = piVar11;
      iVar16 = *piVar7;
      piVar9 = piVar7;
      piVar7 = piVar11;
    }
    piVar11 = piVar10;
    if (*piVar10 < iVar16) {
      dst[2] = piVar10;
      dst[3] = piVar9;
      piVar11 = piVar9;
      piVar9 = piVar10;
    }
    if (*piVar7 < *piVar5) {
      dst[1] = piVar7;
      dst[4] = piVar5;
      piVar5 = piVar7;
    }
    iVar16 = *piVar8;
    iVar14 = *piVar11;
    piVar10 = piVar8;
    if (iVar14 < iVar16) {
      *dst = piVar11;
      dst[3] = piVar8;
      piVar10 = piVar11;
      piVar11 = piVar8;
      iVar16 = iVar14;
    }
    if (*piVar9 < iVar16) {
      *dst = piVar9;
      dst[2] = piVar10;
      piVar9 = piVar10;
    }
    iVar16 = *piVar5;
    iVar14 = *piVar11;
    if (iVar14 < iVar16) {
      dst[1] = piVar11;
      dst[3] = piVar5;
      piVar5 = piVar11;
      iVar16 = iVar14;
    }
    if (iVar16 <= *piVar9) {
      return;
    }
LAB_001082cb:
    dst[1] = piVar9;
    dst[2] = piVar5;
    break;
  case 6:
    piVar10 = dst[1];
    piVar5 = dst[2];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      dst[1] = piVar5;
      dst[2] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[4];
    piVar11 = dst[5];
    piVar7 = piVar10;
    if (*piVar11 < *piVar10) {
      dst[4] = piVar11;
      dst[5] = piVar10;
      piVar7 = piVar11;
      piVar11 = piVar10;
    }
    piVar10 = *dst;
    piVar9 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[2] = piVar10;
      piVar9 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[3];
    piVar12 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[3] = piVar11;
      dst[5] = piVar10;
      piVar12 = piVar10;
      piVar10 = piVar11;
    }
    piVar11 = piVar9;
    if (*piVar8 < *piVar9) {
      *dst = piVar8;
      dst[1] = piVar9;
      piVar11 = piVar8;
      piVar8 = piVar9;
    }
    piVar9 = piVar10;
    if (*piVar7 < *piVar10) {
      dst[3] = piVar7;
      dst[4] = piVar10;
      piVar9 = piVar7;
      piVar7 = piVar10;
    }
    if (*piVar12 < *piVar5) {
      dst[2] = piVar12;
      dst[5] = piVar5;
      piVar5 = piVar12;
    }
    if (*piVar9 < *piVar11) {
      *dst = piVar9;
      dst[3] = piVar11;
      piVar9 = piVar11;
    }
    iVar16 = *piVar8;
    iVar14 = *piVar7;
    piVar10 = piVar7;
    if (iVar14 < iVar16) {
      dst[1] = piVar7;
      dst[4] = piVar8;
      piVar10 = piVar8;
      piVar8 = piVar7;
      iVar14 = iVar16;
    }
    if (iVar14 < *piVar5) {
      dst[2] = piVar10;
      dst[4] = piVar5;
      piVar5 = piVar10;
    }
    iVar16 = *piVar8;
    iVar14 = *piVar9;
    if (iVar14 < iVar16) {
      dst[1] = piVar9;
      dst[3] = piVar8;
      piVar9 = piVar8;
      iVar14 = iVar16;
    }
    if (iVar14 < *piVar5) {
      dst[2] = piVar9;
      dst[3] = piVar5;
    }
    break;
  case 7:
    piVar10 = dst[1];
    piVar5 = dst[2];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      dst[1] = piVar5;
      dst[2] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[3];
    piVar11 = dst[4];
    piVar7 = piVar10;
    if (*piVar11 < *piVar10) {
      dst[3] = piVar11;
      dst[4] = piVar10;
      piVar7 = piVar11;
      piVar11 = piVar10;
    }
    piVar10 = dst[5];
    piVar9 = dst[6];
    piVar12 = piVar10;
    if (*piVar9 < *piVar10) {
      dst[5] = piVar9;
      dst[6] = piVar10;
      piVar12 = piVar9;
      piVar9 = piVar10;
    }
    piVar10 = *dst;
    piVar2 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[2] = piVar10;
      piVar2 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = piVar12;
    if (*piVar12 < *piVar7) {
      dst[3] = piVar12;
      dst[5] = piVar7;
      piVar10 = piVar7;
      piVar7 = piVar12;
    }
    piVar12 = piVar9;
    if (*piVar9 < *piVar11) {
      dst[4] = piVar9;
      dst[6] = piVar11;
      piVar12 = piVar11;
      piVar11 = piVar9;
    }
    piVar9 = piVar2;
    if (*piVar8 < *piVar2) {
      *dst = piVar8;
      dst[1] = piVar2;
      piVar9 = piVar8;
      piVar8 = piVar2;
    }
    piVar2 = piVar11;
    if (*piVar10 < *piVar11) {
      dst[4] = piVar10;
      dst[5] = piVar11;
      piVar2 = piVar10;
      piVar10 = piVar11;
    }
    if (*piVar12 < *piVar5) {
      dst[2] = piVar12;
      dst[6] = piVar5;
      piVar5 = piVar12;
    }
    piVar11 = piVar9;
    if (*piVar2 < *piVar9) {
      *dst = piVar2;
      dst[4] = piVar9;
      piVar11 = piVar2;
      piVar2 = piVar9;
    }
    piVar9 = piVar8;
    if (*piVar10 < *piVar8) {
      dst[1] = piVar10;
      dst[5] = piVar8;
      piVar9 = piVar10;
      piVar10 = piVar8;
    }
    if (*piVar7 < *piVar11) {
      *dst = piVar7;
      dst[3] = piVar11;
      piVar7 = piVar11;
    }
    if (*piVar10 < *piVar5) {
      dst[2] = piVar10;
      dst[5] = piVar5;
      piVar5 = piVar10;
    }
    if (*piVar7 < *piVar9) {
      dst[1] = piVar7;
      dst[3] = piVar9;
      piVar7 = piVar9;
    }
    iVar16 = *piVar5;
    iVar14 = *piVar2;
    if (iVar14 < iVar16) {
      dst[2] = piVar2;
      dst[4] = piVar5;
      piVar5 = piVar2;
      iVar16 = iVar14;
    }
    if (*piVar7 < iVar16) {
      dst[2] = piVar7;
      dst[3] = piVar5;
    }
    break;
  case 8:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[2];
    piVar11 = dst[3];
    piVar7 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[2] = piVar11;
      dst[3] = piVar10;
      piVar7 = piVar10;
      piVar10 = piVar11;
    }
    piVar11 = dst[4];
    piVar9 = dst[5];
    piVar12 = piVar11;
    if (*piVar9 < *piVar11) {
      dst[4] = piVar9;
      dst[5] = piVar11;
      piVar12 = piVar9;
      piVar9 = piVar11;
    }
    piVar11 = dst[6];
    piVar2 = dst[7];
    piVar4 = piVar2;
    if (*piVar2 < *piVar11) {
      dst[6] = piVar2;
      dst[7] = piVar11;
      piVar4 = piVar11;
      piVar11 = piVar2;
    }
    piVar2 = piVar10;
    if (*piVar10 < *piVar8) {
      *dst = piVar10;
      dst[2] = piVar8;
      piVar2 = piVar8;
      piVar8 = piVar10;
    }
    piVar10 = piVar5;
    if (*piVar7 < *piVar5) {
      dst[1] = piVar7;
      dst[3] = piVar5;
      piVar10 = piVar7;
      piVar7 = piVar5;
    }
    piVar5 = piVar11;
    if (*piVar11 < *piVar12) {
      dst[4] = piVar11;
      dst[6] = piVar12;
      piVar5 = piVar12;
      piVar12 = piVar11;
    }
    piVar11 = piVar4;
    if (*piVar4 < *piVar9) {
      dst[5] = piVar4;
      dst[7] = piVar9;
      piVar11 = piVar9;
      piVar9 = piVar4;
    }
    piVar4 = piVar10;
    if (*piVar2 < *piVar10) {
      dst[1] = piVar2;
      dst[2] = piVar10;
      piVar4 = piVar2;
      piVar2 = piVar10;
    }
    piVar10 = piVar9;
    if (*piVar5 < *piVar9) {
      dst[5] = piVar5;
      dst[6] = piVar9;
      piVar10 = piVar5;
      piVar5 = piVar9;
    }
    if (*piVar12 < *piVar8) {
      *dst = piVar12;
      dst[4] = piVar8;
      piVar12 = piVar8;
    }
    if (*piVar11 < *piVar7) {
      dst[3] = piVar11;
      dst[7] = piVar7;
      piVar7 = piVar11;
    }
    piVar8 = piVar4;
    if (*piVar10 < *piVar4) {
      dst[1] = piVar10;
      dst[5] = piVar4;
      piVar8 = piVar10;
      piVar10 = piVar4;
    }
    piVar11 = piVar2;
    if (*piVar5 < *piVar2) {
      dst[2] = piVar5;
      dst[6] = piVar2;
      piVar11 = piVar5;
      piVar5 = piVar2;
    }
    if (*piVar12 < *piVar8) {
      dst[1] = piVar12;
      dst[4] = piVar8;
      piVar12 = piVar8;
    }
    if (*piVar5 < *piVar7) {
      dst[3] = piVar5;
      dst[6] = piVar7;
      piVar7 = piVar5;
    }
    if (*piVar12 < *piVar11) {
      dst[2] = piVar12;
      dst[4] = piVar11;
      piVar12 = piVar11;
    }
    iVar16 = *piVar7;
    iVar14 = *piVar10;
    if (iVar14 < iVar16) {
      dst[3] = piVar10;
      dst[5] = piVar7;
      piVar7 = piVar10;
      iVar16 = iVar14;
    }
    if (*piVar12 < iVar16) {
      dst[3] = piVar12;
      dst[4] = piVar7;
    }
    break;
  case 9:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[3];
    piVar11 = dst[4];
    piVar7 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[3] = piVar11;
      dst[4] = piVar10;
      piVar7 = piVar10;
      piVar10 = piVar11;
    }
    piVar11 = dst[6];
    piVar9 = dst[7];
    piVar12 = piVar11;
    if (*piVar9 < *piVar11) {
      dst[6] = piVar9;
      dst[7] = piVar11;
      piVar12 = piVar9;
      piVar9 = piVar11;
    }
    piVar11 = dst[2];
    piVar2 = piVar5;
    if (*piVar11 < *piVar5) {
      dst[1] = piVar11;
      dst[2] = piVar5;
      piVar2 = piVar11;
      piVar11 = piVar5;
    }
    piVar5 = dst[5];
    piVar4 = piVar7;
    if (*piVar5 < *piVar7) {
      dst[4] = piVar5;
      dst[5] = piVar7;
      piVar4 = piVar5;
      piVar5 = piVar7;
    }
    piVar7 = dst[8];
    piVar1 = piVar9;
    if (*piVar7 < *piVar9) {
      dst[7] = piVar7;
      dst[8] = piVar9;
      piVar1 = piVar7;
      piVar7 = piVar9;
    }
    piVar9 = piVar8;
    if (*piVar2 < *piVar8) {
      *dst = piVar2;
      dst[1] = piVar8;
      piVar9 = piVar2;
      piVar2 = piVar8;
    }
    piVar8 = piVar10;
    if (*piVar4 < *piVar10) {
      dst[3] = piVar4;
      dst[4] = piVar10;
      piVar8 = piVar4;
      piVar4 = piVar10;
    }
    piVar10 = piVar1;
    if (*piVar1 < *piVar12) {
      dst[6] = piVar1;
      dst[7] = piVar12;
      piVar10 = piVar12;
      piVar12 = piVar1;
    }
    piVar1 = piVar5;
    if (*piVar5 < *piVar11) {
      dst[2] = piVar5;
      dst[5] = piVar11;
      piVar1 = piVar11;
      piVar11 = piVar5;
    }
    piVar5 = piVar8;
    if (*piVar8 < *piVar9) {
      *dst = piVar8;
      dst[3] = piVar9;
      piVar5 = piVar9;
      piVar9 = piVar8;
    }
    piVar8 = piVar2;
    if (*piVar4 < *piVar2) {
      dst[1] = piVar4;
      dst[4] = piVar2;
      piVar8 = piVar4;
      piVar4 = piVar2;
    }
    if (*piVar7 < *piVar1) {
      dst[5] = piVar7;
      dst[8] = piVar1;
      piVar1 = piVar7;
    }
    piVar7 = piVar5;
    if (*piVar12 < *piVar5) {
      dst[3] = piVar12;
      dst[6] = piVar5;
      piVar7 = piVar12;
      piVar12 = piVar5;
    }
    piVar5 = piVar4;
    if (*piVar10 < *piVar4) {
      dst[4] = piVar10;
      dst[7] = piVar4;
      piVar5 = piVar10;
      piVar10 = piVar4;
    }
    piVar2 = piVar11;
    if (*piVar1 < *piVar11) {
      dst[2] = piVar1;
      dst[5] = piVar11;
      piVar2 = piVar1;
      piVar1 = piVar11;
    }
    if (*piVar7 < *piVar9) {
      *dst = piVar7;
      dst[3] = piVar9;
      piVar7 = piVar9;
    }
    piVar11 = piVar8;
    if (*piVar5 < *piVar8) {
      dst[1] = piVar5;
      dst[4] = piVar8;
      piVar11 = piVar5;
      piVar5 = piVar8;
    }
    if (*piVar10 < *piVar1) {
      dst[5] = piVar10;
      dst[7] = piVar1;
      piVar1 = piVar10;
    }
    piVar10 = piVar2;
    if (*piVar12 < *piVar2) {
      dst[2] = piVar12;
      dst[6] = piVar2;
      piVar10 = piVar12;
      piVar12 = piVar2;
    }
    if (*piVar7 < *piVar11) {
      dst[1] = piVar7;
      dst[3] = piVar11;
      piVar7 = piVar11;
    }
    iVar16 = *piVar5;
    iVar14 = *piVar12;
    piVar8 = piVar12;
    if (iVar14 < iVar16) {
      dst[4] = piVar12;
      dst[6] = piVar5;
      piVar8 = piVar5;
      piVar5 = piVar12;
      iVar16 = iVar14;
    }
    if (iVar16 < *piVar10) {
      dst[2] = piVar5;
      dst[4] = piVar10;
      piVar10 = piVar5;
    }
    if (*piVar8 < *piVar1) {
      dst[5] = piVar8;
      dst[6] = piVar1;
    }
    if (*piVar7 < *piVar10) {
      dst[2] = piVar7;
      dst[3] = piVar10;
    }
    break;
  case 10:
    piVar10 = dst[4];
    piVar5 = dst[9];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      dst[4] = piVar5;
      dst[9] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[3];
    piVar11 = dst[8];
    piVar7 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[3] = piVar11;
      dst[8] = piVar10;
      piVar7 = piVar10;
      piVar10 = piVar11;
    }
    piVar11 = dst[2];
    piVar9 = dst[7];
    piVar12 = piVar11;
    if (*piVar9 < *piVar11) {
      dst[2] = piVar9;
      dst[7] = piVar11;
      piVar12 = piVar9;
      piVar9 = piVar11;
    }
    piVar11 = dst[1];
    piVar2 = dst[6];
    piVar4 = piVar11;
    if (*piVar2 < *piVar11) {
      dst[1] = piVar2;
      dst[6] = piVar11;
      piVar4 = piVar2;
      piVar2 = piVar11;
    }
    piVar11 = *dst;
    piVar1 = dst[5];
    piVar3 = piVar11;
    if (*piVar1 < *piVar11) {
      *dst = piVar1;
      dst[5] = piVar11;
      piVar3 = piVar1;
      piVar1 = piVar11;
    }
    piVar11 = piVar4;
    if (*piVar8 < *piVar4) {
      dst[1] = piVar8;
      dst[4] = piVar4;
      piVar11 = piVar8;
      piVar8 = piVar4;
    }
    piVar4 = piVar5;
    if (*piVar5 < *piVar2) {
      dst[6] = piVar5;
      dst[9] = piVar2;
      piVar4 = piVar2;
      piVar2 = piVar5;
    }
    piVar5 = piVar3;
    if (*piVar10 < *piVar3) {
      *dst = piVar10;
      dst[3] = piVar3;
      piVar5 = piVar10;
      piVar10 = piVar3;
    }
    piVar3 = piVar1;
    if (*piVar7 < *piVar1) {
      dst[5] = piVar7;
      dst[8] = piVar1;
      piVar3 = piVar7;
      piVar7 = piVar1;
    }
    piVar1 = piVar5;
    if (*piVar12 < *piVar5) {
      *dst = piVar12;
      dst[2] = piVar5;
      piVar1 = piVar12;
      piVar12 = piVar5;
    }
    piVar5 = piVar10;
    if (*piVar2 < *piVar10) {
      dst[3] = piVar2;
      dst[6] = piVar10;
      piVar5 = piVar2;
      piVar2 = piVar10;
    }
    piVar10 = piVar9;
    if (*piVar4 < *piVar9) {
      dst[7] = piVar4;
      dst[9] = piVar9;
      piVar10 = piVar4;
      piVar4 = piVar9;
    }
    if (*piVar11 < *piVar1) {
      *dst = piVar11;
      dst[1] = piVar1;
      piVar11 = piVar1;
    }
    piVar9 = piVar12;
    if (*piVar8 < *piVar12) {
      dst[2] = piVar8;
      dst[4] = piVar12;
      piVar9 = piVar8;
      piVar8 = piVar12;
    }
    piVar12 = piVar10;
    if (*piVar10 < *piVar3) {
      dst[5] = piVar10;
      dst[7] = piVar3;
      piVar12 = piVar3;
      piVar3 = piVar10;
    }
    if (*piVar4 < *piVar7) {
      dst[8] = piVar4;
      dst[9] = piVar7;
      piVar7 = piVar4;
    }
    piVar10 = piVar9;
    if (*piVar9 < *piVar11) {
      dst[1] = piVar9;
      dst[2] = piVar11;
      piVar10 = piVar11;
      piVar11 = piVar9;
    }
    piVar9 = piVar8;
    if (*piVar2 < *piVar8) {
      dst[4] = piVar2;
      dst[6] = piVar8;
      piVar9 = piVar2;
      piVar2 = piVar8;
    }
    piVar8 = piVar7;
    if (*piVar7 < *piVar12) {
      dst[7] = piVar7;
      dst[8] = piVar12;
      piVar8 = piVar12;
      piVar12 = piVar7;
    }
    iVar16 = *piVar5;
    iVar14 = *piVar3;
    piVar7 = piVar3;
    if (iVar14 < iVar16) {
      dst[3] = piVar3;
      dst[5] = piVar5;
      piVar7 = piVar5;
      piVar5 = piVar3;
      iVar14 = iVar16;
    }
    piVar4 = piVar10;
    if (iVar14 < *piVar10) {
      dst[2] = piVar7;
      dst[5] = piVar10;
      piVar4 = piVar7;
      piVar7 = piVar10;
    }
    if (*piVar8 < *piVar2) {
      dst[6] = piVar8;
      dst[8] = piVar2;
      piVar2 = piVar8;
    }
    if (*piVar5 < *piVar11) {
      dst[1] = piVar5;
      dst[3] = piVar11;
      piVar5 = piVar11;
    }
    piVar10 = piVar9;
    if (*piVar12 < *piVar9) {
      dst[4] = piVar12;
      dst[7] = piVar9;
      piVar10 = piVar12;
      piVar12 = piVar9;
    }
    if (*piVar5 < *piVar4) {
      dst[2] = piVar5;
      dst[3] = piVar4;
      piVar5 = piVar4;
    }
    if (*piVar12 < *piVar2) {
      dst[6] = piVar12;
      dst[7] = piVar2;
      piVar2 = piVar12;
    }
    if (*piVar10 < *piVar5) {
      dst[3] = piVar10;
      dst[4] = piVar5;
      piVar10 = piVar5;
    }
    iVar16 = *piVar7;
    iVar14 = *piVar2;
    if (iVar14 < iVar16) {
      dst[5] = piVar2;
      dst[6] = piVar7;
      piVar7 = piVar2;
      iVar16 = iVar14;
    }
    if (iVar16 < *piVar10) {
      dst[4] = piVar7;
      dst[5] = piVar10;
    }
    break;
  case 0xb:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[2];
    piVar11 = dst[3];
    piVar7 = piVar10;
    if (*piVar11 < *piVar10) {
      dst[2] = piVar11;
      dst[3] = piVar10;
      piVar7 = piVar11;
      piVar11 = piVar10;
    }
    piVar10 = dst[4];
    piVar9 = dst[5];
    piVar2 = piVar10;
    if (*piVar9 < *piVar10) {
      dst[4] = piVar9;
      dst[5] = piVar10;
      piVar2 = piVar9;
      piVar9 = piVar10;
    }
    piVar10 = dst[6];
    piVar4 = dst[7];
    piVar1 = piVar10;
    if (*piVar4 < *piVar10) {
      dst[6] = piVar4;
      dst[7] = piVar10;
      piVar1 = piVar4;
      piVar4 = piVar10;
    }
    piVar10 = dst[8];
    piVar12 = dst[9];
    piVar3 = piVar12;
    if (*piVar12 < *piVar10) {
      dst[8] = piVar12;
      dst[9] = piVar10;
      piVar3 = piVar10;
      piVar10 = piVar12;
    }
    piVar13 = piVar5;
    if (*piVar11 < *piVar5) {
      dst[1] = piVar11;
      dst[3] = piVar5;
      piVar13 = piVar11;
      piVar11 = piVar5;
    }
    piVar12 = piVar4;
    if (*piVar4 < *piVar9) {
      dst[5] = piVar4;
      dst[7] = piVar9;
      piVar12 = piVar9;
      piVar9 = piVar4;
    }
    piVar5 = piVar7;
    if (*piVar7 < *piVar8) {
      *dst = piVar7;
      dst[2] = piVar8;
      piVar5 = piVar8;
      piVar8 = piVar7;
    }
    piVar7 = piVar1;
    if (*piVar1 < *piVar2) {
      dst[4] = piVar1;
      dst[6] = piVar2;
      piVar7 = piVar2;
      piVar2 = piVar1;
    }
    piVar4 = dst[10];
    piVar1 = piVar10;
    if (*piVar4 < *piVar10) {
      dst[8] = piVar4;
      dst[10] = piVar10;
      piVar1 = piVar4;
      piVar4 = piVar10;
    }
    piVar10 = piVar5;
    if (*piVar5 < *piVar13) {
      dst[1] = piVar5;
      dst[2] = piVar13;
      piVar10 = piVar13;
      piVar13 = piVar5;
    }
    piVar6 = piVar9;
    if (*piVar7 < *piVar9) {
      dst[5] = piVar7;
      dst[6] = piVar9;
      piVar6 = piVar7;
      piVar7 = piVar9;
    }
    piVar5 = piVar3;
    if (*piVar4 < *piVar3) {
      dst[9] = piVar4;
      dst[10] = piVar3;
      piVar5 = piVar4;
      piVar4 = piVar3;
    }
    piVar3 = piVar8;
    if (*piVar2 < *piVar8) {
      *dst = piVar2;
      dst[4] = piVar8;
      piVar3 = piVar2;
      piVar2 = piVar8;
    }
    piVar17 = piVar11;
    if (*piVar12 < *piVar11) {
      dst[3] = piVar12;
      dst[7] = piVar11;
      piVar17 = piVar12;
      piVar12 = piVar11;
    }
    piVar8 = piVar6;
    if (*piVar6 < *piVar13) {
      dst[1] = piVar6;
      dst[5] = piVar13;
      piVar8 = piVar13;
      piVar13 = piVar6;
    }
    piVar11 = piVar7;
    if (*piVar4 < *piVar7) {
      dst[6] = piVar4;
      dst[10] = piVar7;
      piVar11 = piVar4;
      piVar4 = piVar7;
    }
    piVar15 = piVar2;
    if (*piVar1 < *piVar2) {
      dst[4] = piVar1;
      dst[8] = piVar2;
      piVar15 = piVar1;
      piVar1 = piVar2;
    }
    piVar9 = piVar8;
    if (*piVar5 < *piVar8) {
      dst[5] = piVar5;
      dst[9] = piVar8;
      piVar9 = piVar5;
      piVar5 = piVar8;
    }
    piVar6 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[2] = piVar11;
      dst[6] = piVar10;
      piVar6 = piVar10;
      piVar10 = piVar11;
    }
    if (*piVar15 < *piVar3) {
      *dst = piVar15;
      dst[4] = piVar3;
      piVar15 = piVar3;
    }
    piVar8 = piVar1;
    if (*piVar1 < *piVar17) {
      dst[3] = piVar1;
      dst[8] = piVar17;
      piVar8 = piVar17;
      piVar17 = piVar1;
    }
    piVar7 = piVar13;
    if (*piVar9 < *piVar13) {
      dst[1] = piVar9;
      dst[5] = piVar13;
      piVar7 = piVar9;
      piVar9 = piVar13;
    }
    piVar2 = piVar4;
    if (*piVar4 < *piVar6) {
      dst[6] = piVar4;
      dst[10] = piVar6;
      piVar2 = piVar6;
      piVar6 = piVar4;
    }
    piVar4 = piVar17;
    if (*piVar17 < *piVar10) {
      dst[2] = piVar17;
      dst[3] = piVar10;
      piVar4 = piVar10;
      piVar10 = piVar17;
    }
    goto LAB_001078b8;
  case 0xc:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[2];
    local_70 = dst[3];
    piVar11 = piVar10;
    if (*local_70 < *piVar10) {
      dst[2] = local_70;
      dst[3] = piVar10;
      piVar11 = local_70;
      local_70 = piVar10;
    }
    piVar10 = dst[4];
    piVar7 = dst[5];
    piVar9 = piVar10;
    if (*piVar7 < *piVar10) {
      dst[4] = piVar7;
      dst[5] = piVar10;
      piVar9 = piVar7;
      piVar7 = piVar10;
    }
    piVar10 = dst[6];
    piVar12 = dst[7];
    piVar2 = piVar10;
    if (*piVar12 < *piVar10) {
      dst[6] = piVar12;
      dst[7] = piVar10;
      piVar2 = piVar12;
      piVar12 = piVar10;
    }
    piVar10 = dst[8];
    piVar4 = dst[9];
    piVar1 = piVar4;
    if (*piVar4 < *piVar10) {
      dst[8] = piVar4;
      dst[9] = piVar10;
      piVar1 = piVar10;
      piVar10 = piVar4;
    }
    piVar4 = dst[10];
    piVar3 = dst[0xb];
    piVar6 = piVar3;
    if (*piVar3 < *piVar4) {
      dst[10] = piVar3;
      dst[0xb] = piVar4;
      piVar6 = piVar4;
      piVar4 = piVar3;
    }
    piVar3 = piVar5;
    if (*local_70 < *piVar5) {
      dst[1] = local_70;
      dst[3] = piVar5;
      piVar3 = local_70;
      local_70 = piVar5;
    }
    piVar5 = piVar7;
    if (*piVar12 < *piVar7) {
      dst[5] = piVar12;
      dst[7] = piVar7;
      piVar5 = piVar12;
      piVar12 = piVar7;
    }
    piVar7 = piVar1;
    if (*piVar6 < *piVar1) {
      dst[9] = piVar6;
      dst[0xb] = piVar1;
      piVar7 = piVar6;
      piVar6 = piVar1;
    }
    piVar1 = piVar11;
    if (*piVar11 < *piVar8) {
      *dst = piVar11;
      dst[2] = piVar8;
      piVar1 = piVar8;
      piVar8 = piVar11;
    }
    piVar11 = piVar2;
    if (*piVar2 < *piVar9) {
      dst[4] = piVar2;
      dst[6] = piVar9;
      piVar11 = piVar9;
      piVar9 = piVar2;
    }
    piVar2 = piVar10;
    if (*piVar4 < *piVar10) {
      dst[8] = piVar4;
      dst[10] = piVar10;
      piVar2 = piVar4;
      piVar4 = piVar10;
    }
    piVar10 = piVar1;
    if (*piVar1 < *piVar3) {
      dst[1] = piVar1;
      dst[2] = piVar3;
      piVar10 = piVar3;
      piVar3 = piVar1;
    }
    piVar1 = piVar5;
    if (*piVar11 < *piVar5) {
      dst[5] = piVar11;
      dst[6] = piVar5;
      piVar1 = piVar11;
      piVar11 = piVar5;
    }
    piVar5 = piVar7;
    if (*piVar4 < *piVar7) {
      dst[9] = piVar4;
      dst[10] = piVar7;
      piVar5 = piVar4;
      piVar4 = piVar7;
    }
    piVar7 = piVar8;
    if (*piVar9 < *piVar8) {
      *dst = piVar9;
      dst[4] = piVar8;
      piVar7 = piVar9;
      piVar9 = piVar8;
    }
    piVar8 = piVar6;
    if (*piVar6 < *piVar12) {
      dst[7] = piVar6;
      dst[0xb] = piVar12;
      piVar8 = piVar12;
      piVar12 = piVar6;
    }
    piVar6 = piVar1;
    if (*piVar1 < *piVar3) {
      dst[1] = piVar1;
      dst[5] = piVar3;
      piVar6 = piVar3;
      piVar3 = piVar1;
    }
    piVar1 = piVar11;
    if (*piVar4 < *piVar11) {
      dst[6] = piVar4;
      dst[10] = piVar11;
      piVar1 = piVar4;
      piVar4 = piVar11;
    }
    piVar11 = local_70;
    if (*piVar12 < *local_70) {
      dst[3] = piVar12;
      dst[7] = local_70;
      piVar11 = piVar12;
      piVar12 = local_70;
    }
    piVar15 = piVar9;
    if (*piVar2 < *piVar9) {
      dst[4] = piVar2;
      dst[8] = piVar9;
      piVar15 = piVar2;
      piVar2 = piVar9;
    }
    piVar9 = piVar6;
    if (*piVar5 < *piVar6) {
      dst[5] = piVar5;
      dst[9] = piVar6;
      piVar9 = piVar5;
      piVar5 = piVar6;
    }
    piVar6 = piVar1;
    if (*piVar1 < *piVar10) {
      dst[2] = piVar1;
      dst[6] = piVar10;
      piVar6 = piVar10;
      piVar10 = piVar1;
    }
    if (*piVar15 < *piVar7) {
      *dst = piVar15;
      dst[4] = piVar7;
      piVar15 = piVar7;
    }
    if (*piVar8 < *piVar12) {
      dst[7] = piVar8;
      dst[0xb] = piVar12;
      piVar12 = piVar8;
    }
    piVar8 = piVar2;
    if (*piVar2 < *piVar11) {
      dst[3] = piVar2;
      dst[8] = piVar11;
      piVar8 = piVar11;
      piVar11 = piVar2;
    }
    piVar7 = piVar3;
    if (*piVar9 < *piVar3) {
      dst[1] = piVar9;
      dst[5] = piVar3;
      piVar7 = piVar9;
      piVar9 = piVar3;
    }
    piVar2 = piVar4;
    if (*piVar4 < *piVar6) {
      dst[6] = piVar4;
      dst[10] = piVar6;
      piVar2 = piVar6;
      piVar6 = piVar4;
    }
    piVar4 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[2] = piVar11;
      dst[3] = piVar10;
      piVar4 = piVar10;
      piVar10 = piVar11;
    }
LAB_001078b8:
    piVar11 = piVar5;
    if (*piVar5 < *piVar8) {
      dst[8] = piVar5;
      dst[9] = piVar8;
      piVar11 = piVar8;
      piVar8 = piVar5;
    }
    if (*piVar15 < *piVar7) {
      dst[1] = piVar15;
      dst[4] = piVar7;
      piVar15 = piVar7;
    }
    if (*piVar2 < *piVar12) {
      dst[7] = piVar2;
      dst[10] = piVar12;
      piVar12 = piVar2;
    }
    piVar5 = piVar9;
    if (*piVar9 < *piVar4) {
      dst[3] = piVar9;
      dst[5] = piVar4;
      piVar5 = piVar4;
      piVar4 = piVar9;
    }
    piVar7 = piVar6;
    if (*piVar8 < *piVar6) {
      dst[6] = piVar8;
      dst[8] = piVar6;
      piVar7 = piVar8;
      piVar8 = piVar6;
    }
    if (*piVar15 < *piVar10) {
      dst[2] = piVar15;
      dst[4] = piVar10;
      piVar15 = piVar10;
    }
    if (*piVar11 < *piVar12) {
      dst[7] = piVar11;
      dst[9] = piVar12;
      piVar12 = piVar11;
    }
    if (*piVar7 < *piVar5) {
      dst[5] = piVar7;
      dst[6] = piVar5;
    }
    if (*piVar15 < *piVar4) {
      dst[3] = piVar15;
      dst[4] = piVar4;
    }
    if (*piVar8 < *piVar12) {
      dst[7] = piVar8;
      dst[8] = piVar12;
    }
    break;
  case 0xd:
    piVar10 = dst[1];
    piVar5 = dst[7];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      dst[1] = piVar5;
      dst[7] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[9];
    piVar11 = dst[0xb];
    piVar7 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[9] = piVar11;
      dst[0xb] = piVar10;
      piVar7 = piVar10;
      piVar10 = piVar11;
    }
    piVar11 = dst[3];
    piVar9 = dst[4];
    piVar12 = piVar11;
    if (*piVar9 < *piVar11) {
      dst[3] = piVar9;
      dst[4] = piVar11;
      piVar12 = piVar9;
      piVar9 = piVar11;
    }
    piVar11 = dst[5];
    piVar2 = dst[8];
    piVar4 = piVar11;
    if (*piVar2 < *piVar11) {
      dst[5] = piVar2;
      dst[8] = piVar11;
      piVar4 = piVar2;
      piVar2 = piVar11;
    }
    piVar11 = *dst;
    piVar1 = dst[0xc];
    piVar3 = piVar11;
    if (*piVar1 < *piVar11) {
      *dst = piVar1;
      dst[0xc] = piVar11;
      piVar3 = piVar1;
      piVar1 = piVar11;
    }
    piVar11 = dst[2];
    piVar6 = dst[6];
    piVar15 = piVar11;
    if (*piVar6 < *piVar11) {
      dst[2] = piVar6;
      dst[6] = piVar11;
      piVar15 = piVar6;
      piVar6 = piVar11;
    }
    local_70 = piVar3;
    if (*piVar8 < *piVar3) {
      *dst = piVar8;
      dst[1] = piVar3;
      local_70 = piVar8;
      piVar8 = piVar3;
    }
    piVar11 = piVar15;
    if (*piVar12 < *piVar15) {
      dst[2] = piVar12;
      dst[3] = piVar15;
      piVar11 = piVar12;
      piVar12 = piVar15;
    }
    piVar3 = piVar6;
    if (*piVar6 < *piVar9) {
      dst[4] = piVar6;
      dst[6] = piVar9;
      piVar3 = piVar9;
      piVar9 = piVar6;
    }
    piVar6 = piVar7;
    if (*piVar7 < *piVar2) {
      dst[8] = piVar7;
      dst[0xb] = piVar2;
      piVar6 = piVar2;
      piVar2 = piVar7;
    }
    piVar7 = piVar1;
    if (*piVar1 < *piVar5) {
      dst[7] = piVar1;
      dst[0xc] = piVar5;
      piVar7 = piVar5;
      piVar5 = piVar1;
    }
    piVar1 = piVar10;
    if (*piVar10 < *piVar4) {
      dst[5] = piVar10;
      dst[9] = piVar4;
      piVar1 = piVar4;
      piVar4 = piVar10;
    }
    piVar10 = piVar11;
    if (*piVar11 < *local_70) {
      *dst = piVar11;
      dst[2] = local_70;
      piVar10 = local_70;
      local_70 = piVar11;
    }
    piVar11 = piVar12;
    if (*piVar5 < *piVar12) {
      dst[3] = piVar5;
      dst[7] = piVar12;
      piVar11 = piVar5;
      piVar5 = piVar12;
    }
    piVar12 = dst[10];
    piVar15 = piVar6;
    if (*piVar6 < *piVar12) {
      dst[10] = piVar6;
      dst[0xb] = piVar12;
      piVar15 = piVar12;
      piVar12 = piVar6;
    }
    piVar6 = piVar8;
    if (*piVar9 < *piVar8) {
      dst[1] = piVar9;
      dst[4] = piVar8;
      piVar6 = piVar9;
      piVar9 = piVar8;
    }
    piVar8 = piVar7;
    if (*piVar7 < *piVar3) {
      dst[6] = piVar7;
      dst[0xc] = piVar3;
      piVar8 = piVar3;
      piVar3 = piVar7;
    }
    piVar7 = piVar5;
    if (*piVar2 < *piVar5) {
      dst[7] = piVar2;
      dst[8] = piVar5;
      piVar7 = piVar2;
      piVar2 = piVar5;
    }
    if (*piVar8 < *piVar15) {
      dst[0xb] = piVar8;
      dst[0xc] = piVar15;
      piVar15 = piVar8;
    }
    piVar5 = piVar9;
    if (*piVar1 < *piVar9) {
      dst[4] = piVar1;
      dst[9] = piVar9;
      piVar5 = piVar1;
      piVar1 = piVar9;
    }
    piVar8 = piVar12;
    if (*piVar12 < *piVar3) {
      dst[6] = piVar12;
      dst[10] = piVar3;
      piVar8 = piVar3;
      piVar3 = piVar12;
    }
    piVar9 = piVar11;
    if (*piVar5 < *piVar11) {
      dst[3] = piVar5;
      dst[4] = piVar11;
      piVar9 = piVar5;
      piVar5 = piVar11;
    }
    piVar11 = piVar3;
    if (*piVar3 < *piVar4) {
      dst[5] = piVar3;
      dst[6] = piVar4;
      piVar11 = piVar4;
      piVar4 = piVar3;
    }
    piVar12 = piVar1;
    if (*piVar1 < *piVar2) {
      dst[8] = piVar1;
      dst[9] = piVar2;
      piVar12 = piVar2;
      piVar2 = piVar1;
    }
    piVar1 = piVar15;
    if (*piVar15 < *piVar8) {
      dst[10] = piVar15;
      dst[0xb] = piVar8;
      piVar1 = piVar8;
      piVar8 = piVar15;
    }
    piVar3 = piVar7;
    if (*piVar7 < *piVar6) {
      dst[1] = piVar7;
      dst[7] = piVar6;
      piVar3 = piVar6;
      piVar6 = piVar7;
    }
    piVar7 = piVar11;
    if (*piVar11 < *piVar10) {
      dst[2] = piVar11;
      dst[6] = piVar10;
      piVar7 = piVar10;
      piVar10 = piVar11;
    }
    if (*piVar1 < *piVar12) {
      dst[9] = piVar1;
      dst[0xb] = piVar12;
      piVar12 = piVar1;
    }
    piVar11 = piVar6;
    if (*piVar9 < *piVar6) {
      dst[1] = piVar9;
      dst[3] = piVar6;
      piVar11 = piVar9;
      piVar9 = piVar6;
    }
    piVar1 = piVar5;
    if (*piVar3 < *piVar5) {
      dst[4] = piVar3;
      dst[7] = piVar5;
      piVar1 = piVar3;
      piVar3 = piVar5;
    }
    piVar5 = piVar8;
    if (*piVar8 < *piVar2) {
      dst[8] = piVar8;
      dst[10] = piVar2;
      piVar5 = piVar2;
      piVar2 = piVar8;
    }
    iVar16 = *local_70;
    iVar14 = *piVar4;
    if (iVar14 < iVar16) {
      *dst = piVar4;
      dst[5] = local_70;
      piVar4 = local_70;
      iVar14 = iVar16;
    }
    piVar8 = piVar4;
    if (iVar14 < *piVar10) {
      dst[2] = piVar4;
      dst[5] = piVar10;
      piVar8 = piVar10;
      piVar10 = piVar4;
    }
    piVar4 = piVar7;
    if (*piVar2 < *piVar7) {
      dst[6] = piVar2;
      dst[8] = piVar7;
      piVar4 = piVar2;
      piVar2 = piVar7;
    }
    if (*piVar5 < *piVar12) {
      dst[9] = piVar5;
      dst[10] = piVar12;
      piVar12 = piVar5;
    }
    if (*piVar10 < *piVar11) {
      dst[1] = piVar10;
      dst[2] = piVar11;
      piVar10 = piVar11;
    }
    piVar5 = piVar8;
    if (*piVar8 < *piVar9) {
      dst[3] = piVar8;
      dst[5] = piVar9;
      piVar5 = piVar9;
      piVar9 = piVar8;
    }
    piVar8 = piVar3;
    if (*piVar2 < *piVar3) {
      dst[7] = piVar2;
      dst[8] = piVar3;
      piVar8 = piVar2;
      piVar2 = piVar3;
    }
    piVar11 = piVar1;
    if (*piVar4 < *piVar1) {
      dst[4] = piVar4;
      dst[6] = piVar1;
      piVar11 = piVar4;
      piVar4 = piVar1;
    }
    if (*piVar9 < *piVar10) {
      dst[2] = piVar9;
      dst[3] = piVar10;
      piVar9 = piVar10;
    }
    piVar10 = piVar11;
    if (*piVar5 < *piVar11) {
      dst[4] = piVar5;
      dst[5] = piVar11;
      piVar10 = piVar5;
      piVar5 = piVar11;
    }
    if (*piVar8 < *piVar4) {
      dst[6] = piVar8;
      dst[7] = piVar4;
      piVar4 = piVar8;
    }
    if (*piVar12 < *piVar2) {
      dst[8] = piVar12;
      dst[9] = piVar2;
    }
    if (*piVar10 < *piVar9) {
      dst[3] = piVar10;
      dst[4] = piVar9;
    }
    if (*piVar4 < *piVar5) {
      dst[5] = piVar4;
      dst[6] = piVar5;
    }
    break;
  case 0xe:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[2];
    piVar11 = dst[3];
    local_68 = piVar10;
    if (*piVar11 < *piVar10) {
      dst[2] = piVar11;
      dst[3] = piVar10;
      local_68 = piVar11;
      piVar11 = piVar10;
    }
    piVar10 = dst[4];
    piVar7 = dst[5];
    piVar9 = piVar7;
    if (*piVar7 < *piVar10) {
      dst[4] = piVar7;
      dst[5] = piVar10;
      piVar9 = piVar10;
      piVar10 = piVar7;
    }
    piVar7 = dst[6];
    local_60 = dst[7];
    piVar12 = piVar7;
    if (*local_60 < *piVar7) {
      dst[6] = local_60;
      dst[7] = piVar7;
      piVar12 = local_60;
      local_60 = piVar7;
    }
    piVar7 = dst[8];
    piVar2 = dst[9];
    piVar4 = piVar2;
    if (*piVar2 < *piVar7) {
      dst[8] = piVar2;
      dst[9] = piVar7;
      piVar4 = piVar7;
      piVar7 = piVar2;
    }
    piVar2 = dst[10];
    piVar1 = dst[0xb];
    local_70 = piVar2;
    if (*piVar1 < *piVar2) {
      dst[10] = piVar1;
      dst[0xb] = piVar2;
      local_70 = piVar1;
      piVar1 = piVar2;
    }
    piVar2 = dst[0xc];
    piVar3 = dst[0xd];
    local_50 = piVar2;
    if (*piVar3 < *piVar2) {
      dst[0xc] = piVar3;
      dst[0xd] = piVar2;
      local_50 = piVar3;
      piVar3 = piVar2;
    }
    piVar2 = piVar8;
    if (*local_68 < *piVar8) {
      *dst = local_68;
      dst[2] = piVar8;
      piVar2 = local_68;
      local_68 = piVar8;
    }
    piVar8 = piVar12;
    if (*piVar12 < *piVar10) {
      dst[4] = piVar12;
      dst[6] = piVar10;
      piVar8 = piVar10;
      piVar10 = piVar12;
    }
    piVar12 = piVar7;
    if (*local_70 < *piVar7) {
      dst[8] = local_70;
      dst[10] = piVar7;
      piVar12 = local_70;
      local_70 = piVar7;
    }
    piVar7 = piVar11;
    if (*piVar11 < *piVar5) {
      dst[1] = piVar11;
      dst[3] = piVar5;
      piVar7 = piVar5;
      piVar5 = piVar11;
    }
    piVar11 = piVar9;
    if (*local_60 < *piVar9) {
      dst[5] = local_60;
      dst[7] = piVar9;
      piVar11 = local_60;
      local_60 = piVar9;
    }
    piVar9 = piVar1;
    if (*piVar1 < *piVar4) {
      dst[9] = piVar1;
      dst[0xb] = piVar4;
      piVar9 = piVar4;
      piVar4 = piVar1;
    }
    piVar1 = piVar2;
    if (*piVar10 < *piVar2) {
      *dst = piVar10;
      dst[4] = piVar2;
      piVar1 = piVar10;
      piVar10 = piVar2;
    }
    piVar2 = piVar12;
    if (*local_50 < *piVar12) {
      dst[8] = local_50;
      dst[0xc] = piVar12;
      piVar2 = local_50;
      local_50 = piVar12;
    }
    piVar12 = piVar11;
    if (*piVar11 < *piVar5) {
      dst[1] = piVar11;
      dst[5] = piVar5;
      piVar12 = piVar5;
      piVar5 = piVar11;
    }
    piVar11 = piVar4;
    if (*piVar3 < *piVar4) {
      dst[9] = piVar3;
      dst[0xd] = piVar4;
      piVar11 = piVar3;
      piVar3 = piVar4;
    }
    piVar4 = local_68;
    local_58 = piVar8;
    if (*piVar8 < *local_68) {
      dst[2] = piVar8;
      dst[6] = local_68;
      local_58 = local_68;
      piVar4 = piVar8;
    }
    piVar8 = piVar7;
    if (*local_60 < *piVar7) {
      dst[3] = local_60;
      dst[7] = piVar7;
      piVar8 = local_60;
      local_60 = piVar7;
    }
    if (*piVar2 < *piVar1) {
      *dst = piVar2;
      dst[8] = piVar1;
      piVar2 = piVar1;
    }
    piVar7 = piVar11;
    local_68 = piVar5;
    if (*piVar11 < *piVar5) {
      dst[1] = piVar11;
      dst[9] = piVar5;
      piVar7 = piVar5;
      local_68 = piVar11;
    }
    piVar5 = local_70;
    if (*local_70 < *piVar4) {
      dst[2] = local_70;
      dst[10] = piVar4;
      piVar5 = piVar4;
      piVar4 = local_70;
    }
    piVar11 = piVar8;
    if (*piVar9 < *piVar8) {
      dst[3] = piVar9;
      dst[0xb] = piVar8;
      piVar11 = piVar9;
      piVar9 = piVar8;
    }
    local_70 = local_50;
    if (*local_50 < *piVar10) {
      dst[4] = local_50;
      dst[0xc] = piVar10;
      local_70 = piVar10;
      piVar10 = local_50;
    }
    iVar16 = *piVar12;
    iVar14 = *piVar3;
    piVar1 = piVar3;
    if (iVar14 < iVar16) {
      dst[5] = piVar3;
      dst[0xd] = piVar12;
      piVar1 = piVar12;
      piVar12 = piVar3;
      iVar16 = iVar14;
    }
    piVar3 = piVar12;
    if (*piVar5 < iVar16) {
      dst[5] = piVar5;
      dst[10] = piVar12;
      piVar3 = piVar5;
      piVar5 = piVar12;
    }
    piVar8 = local_58;
    if (*piVar7 < *local_58) {
      dst[6] = piVar7;
      dst[9] = local_58;
      piVar8 = piVar7;
      piVar7 = local_58;
    }
    piVar12 = piVar11;
    if (*local_70 < *piVar11) {
      dst[3] = local_70;
      dst[0xc] = piVar11;
      piVar12 = local_70;
      local_70 = piVar11;
    }
    local_58 = piVar9;
    if (*piVar9 < *local_60) {
      dst[7] = piVar9;
      dst[0xb] = local_60;
      local_58 = local_60;
      local_60 = piVar9;
    }
    piVar11 = local_68;
    if (*piVar4 < *local_68) {
      dst[1] = piVar4;
      dst[2] = local_68;
      piVar11 = piVar4;
      piVar4 = local_68;
    }
    iVar16 = *piVar10;
    iVar14 = *piVar2;
    piVar9 = piVar10;
    if (iVar14 < iVar16) {
      dst[4] = piVar2;
      dst[8] = piVar10;
      piVar9 = piVar2;
      piVar2 = piVar10;
      iVar16 = iVar14;
    }
    if (iVar16 < *piVar11) {
      dst[1] = piVar9;
      dst[4] = piVar11;
      piVar9 = piVar11;
    }
    piVar10 = local_60;
    if (*piVar1 < *local_60) {
      dst[7] = piVar1;
      dst[0xd] = local_60;
      piVar10 = piVar1;
      piVar1 = local_60;
    }
    piVar11 = piVar2;
    if (*piVar2 < *piVar4) {
      dst[2] = piVar2;
      dst[8] = piVar4;
      piVar11 = piVar4;
      piVar4 = piVar2;
    }
    piVar2 = piVar8;
    if (*piVar8 < *piVar3) {
      dst[5] = piVar8;
      dst[6] = piVar3;
      piVar2 = piVar3;
      piVar3 = piVar8;
    }
    piVar8 = piVar7;
    if (*piVar5 < *piVar7) {
      dst[9] = piVar5;
      dst[10] = piVar7;
      piVar8 = piVar5;
      piVar5 = piVar7;
    }
    if (*piVar9 < *piVar4) {
      dst[2] = piVar9;
      dst[4] = piVar4;
      piVar9 = piVar4;
    }
    if (*piVar1 < *local_58) {
      dst[0xb] = piVar1;
      dst[0xd] = local_58;
      local_58 = piVar1;
    }
    piVar7 = piVar11;
    if (*piVar11 < *piVar12) {
      dst[3] = piVar11;
      dst[8] = piVar12;
      piVar7 = piVar12;
      piVar12 = piVar11;
    }
    piVar11 = piVar10;
    if (*local_70 < *piVar10) {
      dst[7] = local_70;
      dst[0xc] = piVar10;
      piVar11 = local_70;
      local_70 = piVar10;
    }
    piVar10 = piVar2;
    if (*piVar7 < *piVar2) {
      dst[6] = piVar7;
      dst[8] = piVar2;
      piVar10 = piVar7;
      piVar7 = piVar2;
    }
    piVar2 = local_70;
    if (*local_70 < *piVar5) {
      dst[10] = local_70;
      dst[0xc] = piVar5;
      piVar2 = piVar5;
      piVar5 = local_70;
    }
    piVar4 = piVar3;
    if (*piVar3 < *piVar12) {
      dst[3] = piVar3;
      dst[5] = piVar12;
      piVar4 = piVar12;
      piVar12 = piVar3;
    }
    piVar1 = piVar11;
    if (*piVar8 < *piVar11) {
      dst[7] = piVar8;
      dst[9] = piVar11;
      piVar1 = piVar8;
      piVar8 = piVar11;
    }
    if (*piVar9 < *piVar12) {
      dst[3] = piVar9;
      dst[4] = piVar12;
    }
    if (*piVar10 < *piVar4) {
      dst[5] = piVar10;
      dst[6] = piVar4;
      piVar10 = piVar4;
    }
    piVar9 = piVar7;
    if (*piVar7 < *piVar1) {
      dst[7] = piVar7;
      dst[8] = piVar1;
      piVar9 = piVar1;
      piVar1 = piVar7;
    }
    if (*piVar5 < *piVar8) {
      dst[9] = piVar5;
      dst[10] = piVar8;
      piVar8 = piVar5;
    }
    if (*piVar2 < *local_58) {
      dst[0xb] = piVar2;
      dst[0xc] = local_58;
    }
    if (*piVar1 < *piVar10) {
      dst[6] = piVar1;
      dst[7] = piVar10;
    }
    goto LAB_00108252;
  case 0xf:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar5;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar10;
      piVar10 = piVar5;
    }
    local_68 = dst[2];
    piVar5 = dst[3];
    piVar11 = piVar5;
    if (*piVar5 < *local_68) {
      dst[2] = piVar5;
      dst[3] = local_68;
      piVar11 = local_68;
      local_68 = piVar5;
    }
    piVar5 = dst[4];
    piVar7 = dst[5];
    piVar9 = piVar7;
    if (*piVar7 < *piVar5) {
      dst[4] = piVar7;
      dst[5] = piVar5;
      piVar9 = piVar5;
      piVar5 = piVar7;
    }
    local_70 = dst[6];
    piVar7 = dst[7];
    piVar12 = piVar7;
    if (*piVar7 < *local_70) {
      dst[6] = piVar7;
      dst[7] = local_70;
      piVar12 = local_70;
      local_70 = piVar7;
    }
    piVar7 = dst[8];
    piVar2 = dst[9];
    piVar4 = piVar2;
    if (*piVar2 < *piVar7) {
      dst[8] = piVar2;
      dst[9] = piVar7;
      piVar4 = piVar7;
      piVar7 = piVar2;
    }
    piVar2 = dst[10];
    local_60 = dst[0xb];
    local_58 = piVar2;
    if (*local_60 < *piVar2) {
      dst[10] = local_60;
      dst[0xb] = piVar2;
      local_58 = local_60;
      local_60 = piVar2;
    }
    piVar2 = dst[0xc];
    piVar1 = dst[0xd];
    local_50 = piVar2;
    if (*piVar1 < *piVar2) {
      dst[0xc] = piVar1;
      dst[0xd] = piVar2;
      local_50 = piVar1;
      piVar1 = piVar2;
    }
    piVar2 = piVar10;
    if (*local_68 < *piVar10) {
      *dst = local_68;
      dst[2] = piVar10;
      piVar2 = local_68;
      local_68 = piVar10;
    }
    piVar10 = local_70;
    if (*local_70 < *piVar5) {
      dst[4] = local_70;
      dst[6] = piVar5;
      piVar10 = piVar5;
      piVar5 = local_70;
    }
    local_70 = piVar5;
    piVar5 = piVar7;
    if (*local_58 < *piVar7) {
      dst[8] = local_58;
      dst[10] = piVar7;
      piVar5 = local_58;
      local_58 = piVar7;
    }
    piVar7 = dst[0xe];
    piVar3 = piVar7;
    if (*piVar7 < *local_50) {
      dst[0xc] = piVar7;
      dst[0xe] = local_50;
      piVar3 = local_50;
      local_50 = piVar7;
    }
    piVar7 = piVar8;
    if (*piVar11 < *piVar8) {
      dst[1] = piVar11;
      dst[3] = piVar8;
      piVar7 = piVar11;
      piVar11 = piVar8;
    }
    piVar8 = piVar9;
    if (*piVar12 < *piVar9) {
      dst[5] = piVar12;
      dst[7] = piVar9;
      piVar8 = piVar12;
      piVar12 = piVar9;
    }
    piVar9 = piVar4;
    if (*local_60 < *piVar4) {
      dst[9] = local_60;
      dst[0xb] = piVar4;
      piVar9 = local_60;
      local_60 = piVar4;
    }
    piVar4 = local_70;
    if (*local_70 < *piVar2) {
      *dst = local_70;
      dst[4] = piVar2;
      piVar4 = piVar2;
      piVar2 = local_70;
    }
    local_70 = piVar2;
    piVar2 = piVar5;
    if (*local_50 < *piVar5) {
      dst[8] = local_50;
      dst[0xc] = piVar5;
      piVar2 = local_50;
      local_50 = piVar5;
    }
    piVar5 = piVar7;
    if (*piVar8 < *piVar7) {
      dst[1] = piVar8;
      dst[5] = piVar7;
      piVar5 = piVar8;
      piVar8 = piVar7;
    }
    piVar7 = piVar1;
    if (*piVar1 < *piVar9) {
      dst[9] = piVar1;
      dst[0xd] = piVar9;
      piVar7 = piVar9;
      piVar9 = piVar1;
    }
    piVar1 = piVar10;
    if (*piVar10 < *local_68) {
      dst[2] = piVar10;
      dst[6] = local_68;
      piVar1 = local_68;
      local_68 = piVar10;
    }
    piVar10 = local_58;
    if (*piVar3 < *local_58) {
      dst[10] = piVar3;
      dst[0xe] = local_58;
      piVar10 = piVar3;
      piVar3 = local_58;
    }
    piVar6 = piVar11;
    local_58 = piVar12;
    if (*piVar12 < *piVar11) {
      dst[3] = piVar12;
      dst[7] = piVar11;
      piVar6 = piVar12;
      local_58 = piVar11;
    }
    if (*piVar2 < *local_70) {
      *dst = piVar2;
      dst[8] = local_70;
      piVar2 = local_70;
    }
    local_70 = piVar2;
    piVar11 = piVar9;
    if (*piVar9 < *piVar5) {
      dst[1] = piVar9;
      dst[9] = piVar5;
      piVar11 = piVar5;
      piVar5 = piVar9;
    }
    piVar9 = local_68;
    if (*piVar10 < *local_68) {
      dst[2] = piVar10;
      dst[10] = local_68;
      piVar9 = piVar10;
      piVar10 = local_68;
    }
    piVar12 = piVar6;
    if (*local_60 < *piVar6) {
      dst[3] = local_60;
      dst[0xb] = piVar6;
      piVar12 = local_60;
      local_60 = piVar6;
    }
    local_68 = local_50;
    if (*local_50 < *piVar4) {
      dst[4] = local_50;
      dst[0xc] = piVar4;
      local_68 = piVar4;
      piVar4 = local_50;
    }
    piVar2 = piVar7;
    if (*piVar7 < *piVar8) {
      dst[5] = piVar7;
      dst[0xd] = piVar8;
      piVar2 = piVar8;
      piVar8 = piVar7;
    }
    piVar7 = piVar3;
    if (*piVar3 < *piVar1) {
      dst[6] = piVar3;
      dst[0xe] = piVar1;
      piVar7 = piVar1;
      piVar1 = piVar3;
    }
    piVar3 = piVar8;
    if (*piVar10 < *piVar8) {
      dst[5] = piVar10;
      dst[10] = piVar8;
      piVar3 = piVar10;
      piVar10 = piVar8;
    }
    piVar8 = piVar1;
    if (*piVar11 < *piVar1) {
      dst[6] = piVar11;
      dst[9] = piVar1;
      piVar8 = piVar11;
      piVar11 = piVar1;
    }
    piVar1 = piVar12;
    if (*local_68 < *piVar12) {
      dst[3] = local_68;
      dst[0xc] = piVar12;
      piVar1 = local_68;
      local_68 = piVar12;
    }
    piVar12 = piVar2;
    if (*piVar7 < *piVar2) {
      dst[0xd] = piVar7;
      dst[0xe] = piVar2;
      piVar12 = piVar7;
      piVar7 = piVar2;
    }
    piVar2 = local_60;
    if (*local_60 < *local_58) {
      dst[7] = local_60;
      dst[0xb] = local_58;
      piVar2 = local_58;
      local_58 = local_60;
    }
    piVar6 = piVar5;
    if (*piVar9 < *piVar5) {
      dst[1] = piVar9;
      dst[2] = piVar5;
      piVar6 = piVar9;
      piVar9 = piVar5;
    }
    iVar16 = *piVar4;
    iVar14 = *local_70;
    piVar5 = local_70;
    if (iVar14 < iVar16) {
      dst[4] = local_70;
      dst[8] = piVar4;
      piVar5 = piVar4;
      iVar16 = iVar14;
      piVar4 = local_70;
    }
    local_70 = piVar4;
    if (iVar16 < *piVar6) {
      dst[1] = local_70;
      dst[4] = piVar6;
      local_70 = piVar6;
    }
    piVar4 = local_58;
    if (*piVar12 < *local_58) {
      dst[7] = piVar12;
      dst[0xd] = local_58;
      piVar4 = piVar12;
      piVar12 = local_58;
    }
    piVar6 = piVar5;
    if (*piVar5 < *piVar9) {
      dst[2] = piVar5;
      dst[8] = piVar9;
      piVar6 = piVar9;
      piVar9 = piVar5;
    }
    if (*piVar7 < *piVar2) {
      dst[0xb] = piVar7;
      dst[0xe] = piVar2;
      piVar2 = piVar7;
    }
    piVar5 = piVar3;
    local_60 = piVar8;
    if (*piVar8 < *piVar3) {
      dst[5] = piVar8;
      dst[6] = piVar3;
      piVar5 = piVar8;
      local_60 = piVar3;
    }
    piVar8 = piVar11;
    if (*piVar10 < *piVar11) {
      dst[9] = piVar10;
      dst[10] = piVar11;
      piVar8 = piVar10;
      piVar10 = piVar11;
    }
    if (*local_70 < *piVar9) {
      dst[2] = local_70;
      dst[4] = piVar9;
      local_70 = piVar9;
    }
    if (*piVar12 < *piVar2) {
      dst[0xb] = piVar12;
      dst[0xd] = piVar2;
      piVar2 = piVar12;
    }
    piVar11 = piVar6;
    if (*piVar6 < *piVar1) {
      dst[3] = piVar6;
      dst[8] = piVar1;
      piVar11 = piVar1;
      piVar1 = piVar6;
    }
    piVar7 = piVar4;
    if (*local_68 < *piVar4) {
      dst[7] = local_68;
      dst[0xc] = piVar4;
      piVar7 = local_68;
      local_68 = piVar4;
    }
    piVar9 = piVar11;
    if (*piVar11 < *local_60) {
      dst[6] = piVar11;
      dst[8] = local_60;
      piVar9 = local_60;
      local_60 = piVar11;
    }
    piVar11 = piVar10;
    if (*local_68 < *piVar10) {
      dst[10] = local_68;
      dst[0xc] = piVar10;
      piVar11 = local_68;
      local_68 = piVar10;
    }
    piVar10 = piVar5;
    if (*piVar5 < *piVar1) {
      dst[3] = piVar5;
      dst[5] = piVar1;
      piVar10 = piVar1;
      piVar1 = piVar5;
    }
    piVar5 = piVar7;
    if (*piVar8 < *piVar7) {
      dst[7] = piVar8;
      dst[9] = piVar7;
      piVar5 = piVar8;
      piVar8 = piVar7;
    }
    if (*local_70 < *piVar1) {
      dst[3] = local_70;
      dst[4] = piVar1;
    }
    if (*local_60 < *piVar10) {
      dst[5] = local_60;
      dst[6] = piVar10;
      local_60 = piVar10;
    }
    piVar10 = piVar5;
    if (*piVar9 < *piVar5) {
      dst[7] = piVar9;
      dst[8] = piVar5;
      piVar10 = piVar9;
      piVar9 = piVar5;
    }
    if (*piVar11 < *piVar8) {
      dst[9] = piVar11;
      dst[10] = piVar8;
      piVar8 = piVar11;
    }
    if (*local_68 < *piVar2) {
      dst[0xb] = local_68;
      dst[0xc] = piVar2;
    }
    if (*piVar10 < *local_60) {
      dst[6] = piVar10;
      dst[7] = local_60;
    }
LAB_00108252:
    if (*piVar8 < *piVar9) {
      dst[8] = piVar8;
      dst[9] = piVar9;
    }
    break;
  case 0x10:
    piVar10 = *dst;
    piVar5 = dst[1];
    piVar8 = piVar10;
    if (*piVar5 < *piVar10) {
      *dst = piVar5;
      dst[1] = piVar10;
      piVar8 = piVar5;
      piVar5 = piVar10;
    }
    piVar10 = dst[2];
    _sort_swap_temp_102 = dst[3];
    local_58 = piVar10;
    if (*_sort_swap_temp_102 < *piVar10) {
      dst[2] = _sort_swap_temp_102;
      dst[3] = piVar10;
      local_58 = _sort_swap_temp_102;
      _sort_swap_temp_102 = piVar10;
    }
    piVar10 = dst[4];
    local_50 = dst[5];
    piVar11 = piVar10;
    if (*local_50 < *piVar10) {
      dst[4] = local_50;
      dst[5] = piVar10;
      piVar11 = local_50;
      local_50 = piVar10;
    }
    piVar10 = dst[6];
    piVar7 = dst[7];
    local_70 = piVar10;
    if (*piVar7 < *piVar10) {
      dst[6] = piVar7;
      dst[7] = piVar10;
      local_70 = piVar7;
      piVar7 = piVar10;
    }
    piVar10 = dst[8];
    piVar9 = dst[9];
    piVar12 = piVar9;
    if (*piVar9 < *piVar10) {
      dst[8] = piVar9;
      dst[9] = piVar10;
      piVar12 = piVar10;
      piVar10 = piVar9;
    }
    local_38 = dst[10];
    piVar9 = dst[0xb];
    piVar2 = piVar9;
    if (*piVar9 < *local_38) {
      dst[10] = piVar9;
      dst[0xb] = local_38;
      piVar2 = local_38;
      local_38 = piVar9;
    }
    piVar9 = dst[0xc];
    piVar4 = dst[0xd];
    piVar1 = piVar9;
    if (*piVar4 < *piVar9) {
      dst[0xc] = piVar4;
      dst[0xd] = piVar9;
      piVar1 = piVar4;
      piVar4 = piVar9;
    }
    piVar9 = dst[0xe];
    piVar3 = dst[0xf];
    piVar6 = piVar9;
    if (*piVar3 < *piVar9) {
      dst[0xe] = piVar3;
      dst[0xf] = piVar9;
      piVar6 = piVar3;
      piVar3 = piVar9;
    }
    piVar9 = piVar8;
    if (*local_58 < *piVar8) {
      *dst = local_58;
      dst[2] = piVar8;
      piVar9 = local_58;
      local_58 = piVar8;
    }
    piVar8 = piVar11;
    if (*local_70 < *piVar11) {
      dst[4] = local_70;
      dst[6] = piVar11;
      piVar8 = local_70;
      local_70 = piVar11;
    }
    piVar11 = piVar10;
    if (*local_38 < *piVar10) {
      dst[8] = local_38;
      dst[10] = piVar10;
      piVar11 = local_38;
      local_38 = piVar10;
    }
    local_48 = piVar1;
    if (*piVar6 < *piVar1) {
      dst[0xc] = piVar6;
      dst[0xe] = piVar1;
      local_48 = piVar6;
      piVar6 = piVar1;
    }
    piVar10 = piVar5;
    if (*_sort_swap_temp_102 < *piVar5) {
      dst[1] = _sort_swap_temp_102;
      dst[3] = piVar5;
      piVar10 = _sort_swap_temp_102;
      _sort_swap_temp_102 = piVar5;
    }
    local_68 = local_50;
    if (*piVar7 < *local_50) {
      dst[5] = piVar7;
      dst[7] = local_50;
      local_68 = piVar7;
      piVar7 = local_50;
    }
    piVar5 = piVar12;
    if (*piVar2 < *piVar12) {
      dst[9] = piVar2;
      dst[0xb] = piVar12;
      piVar5 = piVar2;
      piVar2 = piVar12;
    }
    piVar12 = piVar3;
    if (*piVar3 < *piVar4) {
      dst[0xd] = piVar3;
      dst[0xf] = piVar4;
      piVar12 = piVar4;
      piVar4 = piVar3;
    }
    piVar1 = piVar9;
    if (*piVar8 < *piVar9) {
      *dst = piVar8;
      dst[4] = piVar9;
      piVar1 = piVar8;
      piVar8 = piVar9;
    }
    piVar9 = piVar11;
    if (*local_48 < *piVar11) {
      dst[8] = local_48;
      dst[0xc] = piVar11;
      piVar9 = local_48;
      local_48 = piVar11;
    }
    piVar11 = piVar10;
    if (*local_68 < *piVar10) {
      dst[1] = local_68;
      dst[5] = piVar10;
      piVar11 = local_68;
      local_68 = piVar10;
    }
    piVar10 = piVar5;
    if (*piVar4 < *piVar5) {
      dst[9] = piVar4;
      dst[0xd] = piVar5;
      piVar10 = piVar4;
      piVar4 = piVar5;
    }
    if (*local_70 < *local_58) {
      dst[2] = local_70;
      dst[6] = local_58;
      local_50 = local_58;
    }
    else {
      local_50 = local_70;
      local_70 = local_58;
    }
    piVar5 = piVar6;
    if (*piVar6 < *local_38) {
      dst[10] = piVar6;
      dst[0xe] = local_38;
      piVar5 = local_38;
      local_38 = piVar6;
    }
    piVar3 = piVar7;
    if (*piVar7 < *_sort_swap_temp_102) {
      dst[3] = piVar7;
      dst[7] = _sort_swap_temp_102;
      piVar3 = _sort_swap_temp_102;
      _sort_swap_temp_102 = piVar7;
    }
    piVar7 = piVar12;
    if (*piVar12 < *piVar2) {
      dst[0xb] = piVar12;
      dst[0xf] = piVar2;
      piVar7 = piVar2;
      piVar2 = piVar12;
    }
    if (*piVar9 < *piVar1) {
      *dst = piVar9;
      dst[8] = piVar1;
      piVar9 = piVar1;
    }
    piVar12 = piVar10;
    local_58 = piVar11;
    if (*piVar10 < *piVar11) {
      dst[1] = piVar10;
      dst[9] = piVar11;
      piVar12 = piVar11;
      local_58 = piVar10;
    }
    piVar10 = local_70;
    if (*local_38 < *local_70) {
      dst[2] = local_38;
      dst[10] = local_70;
      piVar10 = local_38;
      local_38 = local_70;
    }
    piVar11 = piVar2;
    if (*piVar2 < *_sort_swap_temp_102) {
      dst[3] = piVar2;
      dst[0xb] = _sort_swap_temp_102;
      piVar11 = _sort_swap_temp_102;
      _sort_swap_temp_102 = piVar2;
    }
    piVar2 = local_48;
    if (*local_48 < *piVar8) {
      dst[4] = local_48;
      dst[0xc] = piVar8;
      piVar2 = piVar8;
      piVar8 = local_48;
    }
    piVar1 = piVar4;
    if (*piVar4 < *local_68) {
      dst[5] = piVar4;
      dst[0xd] = local_68;
      piVar1 = local_68;
      local_68 = piVar4;
    }
    piVar4 = local_50;
    if (*piVar5 < *local_50) {
      dst[6] = piVar5;
      dst[0xe] = local_50;
      piVar4 = piVar5;
      piVar5 = local_50;
    }
    if (*piVar7 < *piVar3) {
      dst[7] = piVar7;
      dst[0xf] = piVar3;
      piVar3 = piVar7;
    }
    local_70 = local_68;
    local_50 = local_38;
    if (*local_38 < *local_68) {
      dst[5] = local_38;
      dst[10] = local_68;
      local_70 = local_38;
      local_50 = local_68;
    }
    piVar7 = piVar12;
    if (*piVar12 < *piVar4) {
      dst[6] = piVar12;
      dst[9] = piVar4;
      piVar7 = piVar4;
      piVar4 = piVar12;
    }
    piVar12 = _sort_swap_temp_102;
    local_68 = piVar2;
    if (*piVar2 < *_sort_swap_temp_102) {
      dst[3] = piVar2;
      dst[0xc] = _sort_swap_temp_102;
      piVar12 = piVar2;
      local_68 = _sort_swap_temp_102;
    }
    piVar2 = piVar5;
    if (*piVar5 < *piVar1) {
      dst[0xd] = piVar5;
      dst[0xe] = piVar1;
      piVar2 = piVar1;
      piVar1 = piVar5;
    }
    piVar5 = piVar3;
    if (*piVar11 < *piVar3) {
      dst[7] = piVar11;
      dst[0xb] = piVar3;
      piVar5 = piVar11;
      piVar11 = piVar3;
    }
    piVar3 = piVar10;
    if (*piVar10 < *local_58) {
      dst[1] = piVar10;
      dst[2] = local_58;
      piVar3 = local_58;
      local_58 = piVar10;
    }
    iVar16 = *piVar8;
    iVar14 = *piVar9;
    piVar10 = piVar8;
    if (iVar14 < iVar16) {
      dst[4] = piVar9;
      dst[8] = piVar8;
      piVar10 = piVar9;
      piVar9 = piVar8;
      iVar16 = iVar14;
    }
    if (iVar16 < *local_58) {
      dst[1] = piVar10;
      dst[4] = local_58;
      piVar10 = local_58;
    }
    piVar8 = piVar5;
    if (*piVar1 < *piVar5) {
      dst[7] = piVar1;
      dst[0xd] = piVar5;
      piVar8 = piVar1;
      piVar1 = piVar5;
    }
    piVar5 = piVar9;
    if (*piVar9 < *piVar3) {
      dst[2] = piVar9;
      dst[8] = piVar3;
      piVar5 = piVar3;
      piVar3 = piVar9;
    }
    if (*piVar2 < *piVar11) {
      dst[0xb] = piVar2;
      dst[0xe] = piVar11;
      piVar11 = piVar2;
    }
    piVar9 = piVar4;
    if (*piVar4 < *local_70) {
      dst[5] = piVar4;
      dst[6] = local_70;
      piVar9 = local_70;
      local_70 = piVar4;
    }
    piVar2 = piVar7;
    if (*local_50 < *piVar7) {
      dst[9] = local_50;
      dst[10] = piVar7;
      piVar2 = local_50;
      local_50 = piVar7;
    }
    if (*piVar10 < *piVar3) {
      dst[2] = piVar10;
      dst[4] = piVar3;
      piVar10 = piVar3;
    }
    if (*piVar1 < *piVar11) {
      dst[0xb] = piVar1;
      dst[0xd] = piVar11;
      piVar11 = piVar1;
    }
    piVar7 = piVar5;
    if (*piVar5 < *piVar12) {
      dst[3] = piVar5;
      dst[8] = piVar12;
      piVar7 = piVar12;
      piVar12 = piVar5;
    }
    piVar5 = local_68;
    if (*local_68 < *piVar8) {
      dst[7] = local_68;
      dst[0xc] = piVar8;
      piVar5 = piVar8;
      piVar8 = local_68;
    }
    piVar4 = piVar9;
    if (*piVar7 < *piVar9) {
      dst[6] = piVar7;
      dst[8] = piVar9;
      piVar4 = piVar7;
      piVar7 = piVar9;
    }
    piVar9 = local_50;
    if (*piVar5 < *local_50) {
      dst[10] = piVar5;
      dst[0xc] = local_50;
      piVar9 = piVar5;
      piVar5 = local_50;
    }
    piVar1 = local_70;
    if (*local_70 < *piVar12) {
      dst[3] = local_70;
      dst[5] = piVar12;
      piVar1 = piVar12;
      piVar12 = local_70;
    }
    piVar3 = piVar8;
    if (*piVar2 < *piVar8) {
      dst[7] = piVar2;
      dst[9] = piVar8;
      piVar3 = piVar2;
      piVar2 = piVar8;
    }
    if (*piVar10 < *piVar12) {
      dst[3] = piVar10;
      dst[4] = piVar12;
    }
    if (*piVar4 < *piVar1) {
      dst[5] = piVar4;
      dst[6] = piVar1;
      piVar4 = piVar1;
    }
    piVar10 = piVar7;
    if (*piVar7 < *piVar3) {
      dst[7] = piVar7;
      dst[8] = piVar3;
      piVar10 = piVar3;
      piVar3 = piVar7;
    }
    if (*piVar9 < *piVar2) {
      dst[9] = piVar9;
      dst[10] = piVar2;
      piVar2 = piVar9;
    }
    if (*piVar5 < *piVar11) {
      dst[0xb] = piVar5;
      dst[0xc] = piVar11;
    }
    if (*piVar3 < *piVar4) {
      dst[6] = piVar3;
      dst[7] = piVar4;
    }
    if (*piVar2 < *piVar10) {
      dst[8] = piVar2;
      dst[9] = piVar10;
    }
    break;
  default:
    if (size < 2) {
      return;
    }
    stable_binary_insertion_sort_start(dst,1,size);
    return;
  }
  return;
}

Assistant:

void BITONIC_SORT(SORT_TYPE *dst, const size_t size) {
  switch (size) {
  case 0:
  case 1:
    break;

  case 2:
    BITONIC_SORT_2(dst);
    break;

  case 3:
    BITONIC_SORT_3(dst);
    break;

  case 4:
    BITONIC_SORT_4(dst);
    break;

  case 5:
    BITONIC_SORT_5(dst);
    break;

  case 6:
    BITONIC_SORT_6(dst);
    break;

  case 7:
    BITONIC_SORT_7(dst);
    break;

  case 8:
    BITONIC_SORT_8(dst);
    break;

  case 9:
    BITONIC_SORT_9(dst);
    break;

  case 10:
    BITONIC_SORT_10(dst);
    break;

  case 11:
    BITONIC_SORT_11(dst);
    break;

  case 12:
    BITONIC_SORT_12(dst);
    break;

  case 13:
    BITONIC_SORT_13(dst);
    break;

  case 14:
    BITONIC_SORT_14(dst);
    break;

  case 15:
    BITONIC_SORT_15(dst);
    break;

  case 16:
    BITONIC_SORT_16(dst);
    break;

  default:
    BINARY_INSERTION_SORT(dst, size);
  }
}